

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_push_constant_block(CompilerHLSL *this,SPIRVariable *var)

{
  ID *ts;
  ID *__k;
  uint uVar1;
  TypedID<(spirv_cross::Types)1> *pTVar2;
  pointer pcVar3;
  bool bVar4;
  size_type sVar5;
  SPIRType *type;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  string *psVar8;
  runtime_error *this_00;
  pointer pRVar9;
  string *ts_2;
  uint32_t index;
  ulong uVar10;
  char (*ts_9) [69];
  uint32_t local_100;
  uint32_t failed_index;
  pointer local_f8;
  string backup_name;
  string member_name;
  string local_90;
  SPIRVariable *local_70;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_68;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  pointer local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  backup_name._M_dataplus._M_p._0_4_ = (var->super_IVariant).self.id;
  sVar5 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->super_CompilerGLSL).flattened_buffer_blocks._M_h,(key_type *)&backup_name)
  ;
  if (sVar5 == 0) {
    pRVar9 = (this->root_constants_layout).
             super__Vector_base<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58 = (this->root_constants_layout).
               super__Vector_base<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar9 == local_58) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x21])(this,var);
    }
    else {
      ts = &(var->super_IVariant).self;
      local_60 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&(this->super_CompilerGLSL).flattened_structs;
      local_68 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
      local_70 = var;
      do {
        type = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(local_70->super_IVariant).field_0xc);
        failed_index = 0;
        bVar4 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,type,BufferPackingHLSLCbufferPackOffset,
                           &failed_index,pRVar9->start,pRVar9->end);
        if (!bVar4) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&member_name,this,(ulong)(type->super_IVariant).self.id,1);
          ts_9 = (char (*) [69])0x1b17d7;
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&local_90,&this->super_CompilerGLSL,type,failed_index);
          join<char_const(&)[26],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[2],char_const(&)[16],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                    (&backup_name,(spirv_cross *)"Root constant cbuffer ID ",(char (*) [26])ts,
                     (TypedID<(spirv_cross::Types)0> *)" (name: ",(char (*) [9])&member_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
                     (char (*) [2])0x2c170c,(char (*) [16])&failed_index,(uint *)" (name: ",
                     (char (*) [9])&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") cannot be expressed with either HLSL packing layout or packoffset.",ts_9);
          ::std::runtime_error::runtime_error(this_00,(string *)&backup_name);
          *(undefined ***)this_00 = &PTR__runtime_error_0035fca8;
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        __k = &(type->super_IVariant).self;
        Compiler::set_extended_decoration
                  ((Compiler *)this,(type->super_IVariant).self.id,
                   SPIRVCrossDecorationExplicitOffset,0);
        backup_name._M_dataplus._M_p._0_4_ = ts->id;
        pmVar6 = ::std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_60,(key_type *)&backup_name);
        *pmVar6 = false;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&(type->member_name_cache)._M_h);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,ts->id);
        pmVar7 = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_68,__k);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&backup_name,this,(ulong)ts->id,1);
        ts_2 = (string *)(ulong)pRVar9->binding;
        local_f8 = pRVar9;
        to_resource_register_abi_cxx11_
                  (&member_name,this,HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT,'b',pRVar9->binding,
                   pRVar9->space);
        CompilerGLSL::statement<char_const(&)[34],std::__cxx11::string,std::__cxx11::string>
                  (&this->super_CompilerGLSL,(char (*) [34])"cbuffer SPIRV_CROSS_RootConstant_",
                   &backup_name,&member_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)member_name._M_dataplus._M_p != &member_name.field_2) {
          operator_delete(member_name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)backup_name._M_dataplus._M_p != &backup_name.field_2) {
          operator_delete(backup_name._M_dataplus._M_p);
        }
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        if ((pmVar7->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size != 0) {
          uVar10 = 0;
          local_100 = 0;
          pRVar9 = local_f8;
          do {
            uVar1 = (pmVar7->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar10].
                    offset;
            index = (uint32_t)uVar10;
            if ((pRVar9->start <= uVar1) && (uVar1 < pRVar9->end)) {
              pTVar2 = (type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
              CompilerGLSL::add_member_name(&this->super_CompilerGLSL,type,local_100);
              psVar8 = Compiler::get_member_name_abi_cxx11_
                                 ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index);
              backup_name._M_dataplus._M_p = (pointer)&backup_name.field_2;
              pcVar3 = (psVar8->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&backup_name,pcVar3,pcVar3 + psVar8->_M_string_length);
              CompilerGLSL::to_member_name_abi_cxx11_
                        (&member_name,&this->super_CompilerGLSL,type,index);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        ((spirv_cross *)local_50,this,(ulong)ts->id,1);
              join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                        (&local_90,(spirv_cross *)local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2c1f55,(char (*) [2])&member_name,ts_2);
              ::std::__cxx11::string::operator=((string *)&member_name,(string *)&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
              if (local_50[0] != local_40) {
                operator_delete(local_50[0]);
              }
              ParsedIR::sanitize_underscores(&member_name);
              Compiler::set_member_name((Compiler *)this,(TypeID)__k->id,local_100,&member_name);
              uVar1 = pTVar2[uVar10].id;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
              ts_2 = &local_90;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                        (this,type,(ulong)uVar1,uVar10,&local_90,(ulong)local_f8->start);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
              Compiler::set_member_name((Compiler *)this,(TypeID)__k->id,local_100,&backup_name);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)member_name._M_dataplus._M_p != &member_name.field_2) {
                operator_delete(member_name._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)backup_name._M_dataplus._M_p != &backup_name.field_2) {
                operator_delete(backup_name._M_dataplus._M_p);
              }
              local_100 = local_100 + 1;
              pRVar9 = local_f8;
            }
            uVar10 = (ulong)(index + 1);
          } while (uVar10 < (pmVar7->members).super_VectorView<spirv_cross::Meta::Decoration>.
                            buffer_size);
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        pRVar9 = local_f8 + 1;
      } while (pRVar9 != local_58);
    }
  }
  else {
    CompilerGLSL::emit_buffer_block_flattened(&this->super_CompilerGLSL,var);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_push_constant_block(const SPIRVariable &var)
{
	if (flattened_buffer_blocks.count(var.self))
	{
		emit_buffer_block_flattened(var);
	}
	else if (root_constants_layout.empty())
	{
		emit_buffer_block(var);
	}
	else
	{
		for (const auto &layout : root_constants_layout)
		{
			auto &type = get<SPIRType>(var.basetype);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index, layout.start,
			                               layout.end))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("Root constant cbuffer ID ", var.self, " (name: ", to_name(type.self), ")",
				                       ", member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			flattened_structs[var.self] = false;
			type.member_name_cache.clear();
			add_resource_name(var.self);
			auto &memb = ir.meta[type.self].members;

			statement("cbuffer SPIRV_CROSS_RootConstant_", to_name(var.self),
			          to_resource_register(HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT, 'b', layout.binding, layout.space));
			begin_scope();

			// Index of the next field in the generated root constant constant buffer
			auto constant_index = 0u;

			// Iterate over all member of the push constant and check which of the fields
			// fit into the given root constant layout.
			for (auto i = 0u; i < memb.size(); i++)
			{
				const auto offset = memb[i].offset;
				if (layout.start <= offset && offset < layout.end)
				{
					const auto &member = type.member_types[i];

					add_member_name(type, constant_index);
					auto backup_name = get_member_name(type.self, i);
					auto member_name = to_member_name(type, i);
					member_name = join(to_name(var.self), "_", member_name);
					ParsedIR::sanitize_underscores(member_name);
					set_member_name(type.self, constant_index, member_name);
					emit_struct_member(type, member, i, "", layout.start);
					set_member_name(type.self, constant_index, backup_name);

					constant_index++;
				}
			}

			end_scope_decl();
		}
	}
}